

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_smite(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *pCVar2;
  CHAR_DATA *in_RDI;
  char arg1 [4608];
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  uint7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  
  bVar1 = is_npc(in_stack_ffffffffffffedd8);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffedf0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
  }
  else {
    one_argument(in_stack_ffffffffffffede0,(char *)in_stack_ffffffffffffedd8);
    if (in_stack_ffffffffffffede8 == '\0') {
      send_to_char(in_stack_ffffffffffffedf0,(CHAR_DATA *)((ulong)in_stack_ffffffffffffede9 << 8));
    }
    else {
      pCVar2 = get_char_world((CHAR_DATA *)arg1._4568_8_,(char *)arg1._4560_8_);
      if (pCVar2 == (CHAR_DATA *)0x0) {
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
      }
      else {
        bVar1 = is_npc(in_stack_ffffffffffffedd8);
        if (bVar1) {
          send_to_char(in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
        }
        else if (in_RDI == pCVar2) {
          send_to_char(in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
        }
        else {
          act(in_stack_ffffffffffffedf0,
              (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
              in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,0);
          act(in_stack_ffffffffffffedf0,
              (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
              in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,0);
          act(in_stack_ffffffffffffedf0,
              (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
              in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,0);
          pCVar2->hit = pCVar2->hit / 2;
        }
      }
    }
  }
  return;
}

Assistant:

void do_smite(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg1[MAX_INPUT_LENGTH];

	if (is_npc(ch))
	{
		send_to_char("Mobs can't smite.\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: smite <char>\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't playing.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Trying to smite a mob?\n\r", ch);
		return;
	}

	if (ch == victim)
	{
		send_to_char("Trying to smite yourself?\n\r", ch);
		return;
	}

	act("A bolt from the heavens smites $N!", ch, nullptr, victim, TO_NOTVICT);
	act("A bolt from the heavens smites you!", ch, nullptr, victim, TO_VICT);
	act("You smite $N!", ch, nullptr, victim, TO_CHAR);

	victim->hit /= 2;
}